

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_node_t mpack_node_map_uint(mpack_node_t node,uint64_t num)

{
  mpack_node_data_t *data;
  mpack_node_t mVar1;
  uint64_t num_local;
  mpack_node_t node_local;
  
  data = mpack_node_map_uint_impl(node,num);
  mVar1 = mpack_node_wrap_lookup(node.tree,data);
  return mVar1;
}

Assistant:

mpack_node_t mpack_node_map_uint(mpack_node_t node, uint64_t num) {
    return mpack_node_wrap_lookup(node.tree, mpack_node_map_uint_impl(node, num));
}